

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_inlets.h
# Opt level: O0

void __thiscall c74::max::object_inlets::object_inlets(object_inlets *this,void *x)

{
  undefined1 local_48 [8];
  t_mock_inlet inlet;
  void *x_local;
  object_inlets *this_local;
  
  inlet.m_stuffloc = (long *)x;
  std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::vector
            (&this->mock_inlets);
  this->current_inlet = 0;
  t_mock_inlet::t_mock_inlet((t_mock_inlet *)local_48,inlet.m_stuffloc,0,(long *)0x0);
  std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::push_back
            (&this->mock_inlets,(value_type *)local_48);
  t_mock_inlet::~t_mock_inlet((t_mock_inlet *)local_48);
  return;
}

Assistant:

explicit object_inlets(void* x)
    : current_inlet(0)
    {
        t_mock_inlet inlet(x, 0, NULL);

        mock_inlets.push_back(inlet);
    }